

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O3

void __thiscall
Diligent::GLContextState::BindImage
          (GLContextState *this,Uint32 Index,TextureViewGLImpl *pTexView,GLint MipLevel,
          GLboolean IsLayered,GLint Layer,GLenum Access,GLenum Format)

{
  vector<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
  *this_00;
  GLboolean *pGVar1;
  pointer pBVar2;
  bool bVar3;
  Int32 IVar4;
  GLTextureObj *pGVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pBVar8;
  GLenum err;
  BoundImageInfo NewImageInfo;
  string msg;
  uint local_70;
  BoundImageInfo local_6c;
  string local_50;
  
  IVar4 = DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
          ::GetUniqueID((DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
                         *)pTexView);
  pGVar5 = TextureViewGLImpl::GetHandle(pTexView);
  local_6c.GLHandle = pGVar5->m_uiHandle;
  local_6c.IsLayered = IsLayered;
  local_6c.Access = Access;
  local_6c.Format = Format;
  uVar7 = (ulong)Index;
  this_00 = &this->m_BoundImages;
  pBVar8 = (this->m_BoundImages).
           super__Vector_base<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(this->m_BoundImages).
                 super__Vector_base<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar8 >> 2) *
          0x6db6db6db6db6db7;
  local_6c.InterfaceID = IVar4;
  local_6c.MipLevel = MipLevel;
  local_6c.Layer = Layer;
  if (uVar6 < uVar7 || uVar6 - uVar7 == 0) {
    std::
    vector<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
    ::resize(this_00,uVar7 + 1);
    pBVar8 = (this_00->
             super__Vector_base<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  bVar3 = BoundImageInfo::operator!=(pBVar8 + uVar7,&local_6c);
  if (bVar3) {
    pBVar8 = (this_00->
             super__Vector_base<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = pBVar8 + uVar7;
    pGVar1 = &pBVar2->IsLayered;
    pBVar2->IsLayered = local_6c.IsLayered;
    *(undefined3 *)&pBVar2->field_0xd = local_6c._13_3_;
    *(GLint *)(pGVar1 + 4) = local_6c.Layer;
    *(GLenum *)(pGVar1 + 8) = local_6c.Access;
    *(GLenum *)(pGVar1 + 0xc) = local_6c.Format;
    pBVar8 = pBVar8 + uVar7;
    pBVar8->InterfaceID = local_6c.InterfaceID;
    pBVar8->GLHandle = local_6c.GLHandle;
    pBVar8->MipLevel = local_6c.MipLevel;
    pBVar8->IsLayered = local_6c.IsLayered;
    *(undefined3 *)&pBVar8->field_0xd = local_6c._13_3_;
    (*__glewBindImageTexture)(Index,local_6c.GLHandle,MipLevel,IsLayered,Layer,Access,Format);
    local_70 = glGetError();
    if (local_70 != 0) {
      LogError<false,char[28],char[17],unsigned_int>
                (false,"BindImage",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x120,(char (*) [28])"glBindImageTexture() failed",
                 (char (*) [17])"\nGL Error Code: ",&local_70);
      FormatString<char[6]>(&local_50,(char (*) [6])0x32e52e);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"BindImage",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void GLContextState::BindImage(Uint32             Index,
                               TextureViewGLImpl* pTexView,
                               GLint              MipLevel,
                               GLboolean          IsLayered,
                               GLint              Layer,
                               GLenum             Access,
                               GLenum             Format)
{
#if GL_ARB_shader_image_load_store
    BoundImageInfo NewImageInfo //
        {
            pTexView->GetUniqueID(),
            pTexView->GetHandle(),
            MipLevel,
            IsLayered,
            Layer,
            Access,
            Format //
        };
    if (Index >= m_BoundImages.size())
        m_BoundImages.resize(size_t{Index} + 1);
    if (m_BoundImages[Index] != NewImageInfo)
    {
        m_BoundImages[Index] = NewImageInfo;
        glBindImageTexture(Index, NewImageInfo.GLHandle, MipLevel, IsLayered, Layer, Access, Format);
        DEV_CHECK_GL_ERROR("glBindImageTexture() failed");
    }
#else
    UNSUPPORTED("GL_ARB_shader_image_load_store is not supported");
#endif
}